

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::SpirVAssembly::anon_unknown_5::createOpConstantUsageGroup(TestContext *testCtx)

{
  allocator<float> *this;
  value_type vVar1;
  deUint32 seed;
  TestCaseGroup *pTVar2;
  TestNode *pTVar3;
  char *pcVar4;
  reference pvVar5;
  Buffer<float> *pBVar6;
  SpvAsmComputeShaderCase *this_00;
  pointer local_29c;
  int local_294;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_290;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_280;
  allocator<char> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  allocator<char> local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  ulong local_158;
  size_t ndx;
  undefined1 local_148 [8];
  vector<float,_std::allocator<float>_> negativeFloats;
  undefined1 local_128 [8];
  vector<float,_std::allocator<float>_> positiveFloats;
  undefined1 local_108 [4];
  int numElements;
  Random rnd;
  ComputeShaderSpec spec;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"opconstantnullcomposite",
             "Spotcheck the OpConstantNull & OpConstantComposite instruction");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&spec.verifyIO + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar2
            );
  ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)&rnd.m_rnd.z);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pcVar4 = tcu::TestNode::getName(pTVar3);
  seed = deStringHash(pcVar4);
  de::Random::Random((Random *)local_108,seed);
  positiveFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 100;
  negativeFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  this = (allocator<float> *)
         ((long)&negativeFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<float>::allocator(this);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_128,100,
             (value_type_conflict2 *)
             ((long)&negativeFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),this);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&negativeFloats.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  ndx._4_4_ = 0;
  std::allocator<float>::allocator((allocator<float> *)((long)&ndx + 3));
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_148,100,
             (value_type_conflict2 *)((long)&ndx + 4),(allocator<float> *)((long)&ndx + 3));
  std::allocator<float>::~allocator((allocator<float> *)((long)&ndx + 3));
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_128,0);
  fillRandomScalars<float>((Random *)local_108,1.0,100.0,pvVar5,100,0);
  for (local_158 = 0; local_158 < 100; local_158 = local_158 + 1) {
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_128,local_158);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_148,local_158);
    *pvVar5 = -vVar1;
  }
  pcVar4 = getComputeAsmInputOutputBufferTraits();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,pcVar4,&local_219);
  std::operator+(&local_1f8,
                 "OpCapability Shader\n%std450 = OpExtInstImport \"GLSL.std.450\"\nOpMemoryModel Logical GLSL450\nOpEntryPoint GLCompute %main \"main\" %id\nOpExecutionMode %main LocalSize 1 1 1\nOpSource GLSL 430\nOpName %main           \"main\"\nOpName %id             \"gl_GlobalInvocationID\"\nOpDecorate %id BuiltIn GlobalInvocationId\n"
                 ,&local_218);
  pcVar4 = getComputeAsmCommonTypes();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,pcVar4,&local_241);
  std::operator+(&local_1d8,&local_1f8,&local_240);
  std::operator+(&local_1b8,&local_1d8,
                 "%fmat      = OpTypeMatrix %fvec3 3\n%ten       = OpConstant %u32 10\n%f32arr10  = OpTypeArray %f32 %ten\n%fst       = OpTypeStruct %f32 %f32\n"
                );
  pcVar4 = getComputeAsmInputOutputBuffer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,pcVar4,&local_269);
  std::operator+(&local_198,&local_1b8,&local_268);
  std::operator+(&local_178,&local_198,
                 "%id        = OpVariable %uvec3ptr Input\n%zero      = OpConstant %i32 0\n%unull     = OpConstantNull %u32\n%fnull     = OpConstantNull %f32\n%vnull     = OpConstantNull %fvec3\n%mnull     = OpConstantNull %fmat\n%anull     = OpConstantNull %f32arr10\n%snull     = OpConstantComposite %fst %fnull %fnull\n%main      = OpFunction %void None %voidf\n%label     = OpLabel\n%idval     = OpLoad %uvec3 %id\n%x         = OpCompositeExtract %u32 %idval 0\n%inloc     = OpAccessChain %f32ptr %indata %zero %x\n%inval     = OpLoad %f32 %inloc\n%neg       = OpFNegate %f32 %inval\n%unull_cov = OpConvertUToF %f32 %unull\n%unull_abs = OpExtInst %f32 %std450 FAbs %unull_cov\n%fnull_abs = OpExtInst %f32 %std450 FAbs %fnull\n%vnull_0   = OpCompositeExtract %f32 %vnull 0\n%vnull_abs = OpExtInst %f32 %std450 FAbs %vnull_0\n%mnull_12  = OpCompositeExtract %f32 %mnull 1 2\n%mnull_abs = OpExtInst %f32 %std450 FAbs %mnull_12\n%anull_3   = OpCompositeExtract %f32 %anull 3\n%anull_abs = OpExtInst %f32 %std450 FAbs %anull_3\n%snull_1   = OpCompositeExtract %f32 %snull 1\n%snull_abs = OpExtInst %f32 %std450 FAbs %snull_1\n%add1      = OpFAdd %f32 %neg  %unull_abs\n%add2      = OpFAdd %f32 %add1 %fnull_abs\n%add3      = OpFAdd %f32 %add2 %vnull_abs\n%add4      = OpFAdd %f32 %add3 %mnull_abs\n%add5      = OpFAdd %f32 %add4 %anull_abs\n%final     = OpFAdd %f32 %add5 %snull_abs\n%outloc    = OpAccessChain %f32ptr %outdata %zero %x\n             OpStore %outloc %final\n             OpReturn\n             OpFunctionEnd\n"
                );
  std::__cxx11::string::operator=((string *)&rnd.m_rnd.z,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  pBVar6 = (Buffer<float> *)operator_new(0x20);
  Buffer<float>::Buffer(pBVar6,(vector<float,_std::allocator<float>_> *)local_128);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            (&local_280,(BufferInterface *)pBVar6);
  std::
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *)((long)&spec.entryPoint.field_2 + 8),&local_280);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_280);
  pBVar6 = (Buffer<float> *)operator_new(0x20);
  Buffer<float>::Buffer(pBVar6,(vector<float,_std::allocator<float>_> *)local_148);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            (&local_290,(BufferInterface *)pBVar6);
  std::
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *)&spec.inputs.
                  super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_290);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_290);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&local_29c,100,1,1);
  spec.numWorkGroups.m_data[0] = local_294;
  spec.outputs.
  super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_29c;
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  this_00 = (SpvAsmComputeShaderCase *)operator_new(0x140);
  SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
            (this_00,(TestContext *)
                     group.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_8_,"spotcheck",
             "Check that values constructed via OpConstantNull & OpConstantComposite can be used",
             (ComputeShaderSpec *)&rnd.m_rnd.z,COMPUTE_TEST_USES_NONE);
  tcu::TestNode::addChild(pTVar3,(TestNode *)this_00);
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_148);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_128);
  de::Random::~Random((Random *)local_108);
  ComputeShaderSpec::~ComputeShaderSpec((ComputeShaderSpec *)&rnd.m_rnd.z);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createOpConstantUsageGroup (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "opconstantnullcomposite", "Spotcheck the OpConstantNull & OpConstantComposite instruction"));
	ComputeShaderSpec				spec;
	de::Random						rnd				(deStringHash(group->getName()));
	const int						numElements		= 100;
	vector<float>					positiveFloats	(numElements, 0);
	vector<float>					negativeFloats	(numElements, 0);

	fillRandomScalars(rnd, 1.f, 100.f, &positiveFloats[0], numElements);

	for (size_t ndx = 0; ndx < numElements; ++ndx)
		negativeFloats[ndx] = -positiveFloats[ndx];

	spec.assembly =
		"OpCapability Shader\n"
		"%std450 = OpExtInstImport \"GLSL.std.450\"\n"
		"OpMemoryModel Logical GLSL450\n"
		"OpEntryPoint GLCompute %main \"main\" %id\n"
		"OpExecutionMode %main LocalSize 1 1 1\n"

		"OpSource GLSL 430\n"
		"OpName %main           \"main\"\n"
		"OpName %id             \"gl_GlobalInvocationID\"\n"

		"OpDecorate %id BuiltIn GlobalInvocationId\n"

		+ string(getComputeAsmInputOutputBufferTraits()) + string(getComputeAsmCommonTypes()) +

		"%fmat      = OpTypeMatrix %fvec3 3\n"
		"%ten       = OpConstant %u32 10\n"
		"%f32arr10  = OpTypeArray %f32 %ten\n"
		"%fst       = OpTypeStruct %f32 %f32\n"

		+ string(getComputeAsmInputOutputBuffer()) +

		"%id        = OpVariable %uvec3ptr Input\n"
		"%zero      = OpConstant %i32 0\n"

		// Create a bunch of null values
		"%unull     = OpConstantNull %u32\n"
		"%fnull     = OpConstantNull %f32\n"
		"%vnull     = OpConstantNull %fvec3\n"
		"%mnull     = OpConstantNull %fmat\n"
		"%anull     = OpConstantNull %f32arr10\n"
		"%snull     = OpConstantComposite %fst %fnull %fnull\n"

		"%main      = OpFunction %void None %voidf\n"
		"%label     = OpLabel\n"
		"%idval     = OpLoad %uvec3 %id\n"
		"%x         = OpCompositeExtract %u32 %idval 0\n"
		"%inloc     = OpAccessChain %f32ptr %indata %zero %x\n"
		"%inval     = OpLoad %f32 %inloc\n"
		"%neg       = OpFNegate %f32 %inval\n"

		// Get the abs() of (a certain element of) those null values
		"%unull_cov = OpConvertUToF %f32 %unull\n"
		"%unull_abs = OpExtInst %f32 %std450 FAbs %unull_cov\n"
		"%fnull_abs = OpExtInst %f32 %std450 FAbs %fnull\n"
		"%vnull_0   = OpCompositeExtract %f32 %vnull 0\n"
		"%vnull_abs = OpExtInst %f32 %std450 FAbs %vnull_0\n"
		"%mnull_12  = OpCompositeExtract %f32 %mnull 1 2\n"
		"%mnull_abs = OpExtInst %f32 %std450 FAbs %mnull_12\n"
		"%anull_3   = OpCompositeExtract %f32 %anull 3\n"
		"%anull_abs = OpExtInst %f32 %std450 FAbs %anull_3\n"
		"%snull_1   = OpCompositeExtract %f32 %snull 1\n"
		"%snull_abs = OpExtInst %f32 %std450 FAbs %snull_1\n"

		// Add them all
		"%add1      = OpFAdd %f32 %neg  %unull_abs\n"
		"%add2      = OpFAdd %f32 %add1 %fnull_abs\n"
		"%add3      = OpFAdd %f32 %add2 %vnull_abs\n"
		"%add4      = OpFAdd %f32 %add3 %mnull_abs\n"
		"%add5      = OpFAdd %f32 %add4 %anull_abs\n"
		"%final     = OpFAdd %f32 %add5 %snull_abs\n"

		"%outloc    = OpAccessChain %f32ptr %outdata %zero %x\n"
		"             OpStore %outloc %final\n" // write to output
		"             OpReturn\n"
		"             OpFunctionEnd\n";
	spec.inputs.push_back(BufferSp(new Float32Buffer(positiveFloats)));
	spec.outputs.push_back(BufferSp(new Float32Buffer(negativeFloats)));
	spec.numWorkGroups = IVec3(numElements, 1, 1);

	group->addChild(new SpvAsmComputeShaderCase(testCtx, "spotcheck", "Check that values constructed via OpConstantNull & OpConstantComposite can be used", spec));

	return group.release();
}